

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nn.cc
# Opt level: O0

void predict_or_learn_multi<true,true>(nn *n,single_learner *base,example *ec)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  uchar *puVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  code *pcVar10;
  long *plVar11;
  double dVar12;
  uchar *puVar13;
  uchar *puVar14;
  size_t sVar15;
  uchar *puVar16;
  uchar *puVar17;
  uchar *puVar18;
  uchar *puVar19;
  ostream *poVar20;
  float *pfVar21;
  unsigned_long *puVar22;
  v_array<unsigned_char> *in_RDX;
  uint *in_RDI;
  float fVar23;
  uint uVar24;
  uint i_6;
  float gradhw;
  float nu;
  float sigmahprime;
  float sigmah_1;
  uint i_5;
  float gradient;
  features save_nn_output_namespace;
  float sqrtk;
  float wf;
  features *out_fs;
  float sigmah;
  uint i_4;
  float save_ec_loss;
  float save_final_prediction;
  float save_partial_prediction;
  bool converse;
  uint i_3;
  uint i_2;
  uint i_1;
  uint i;
  uint64_t save_ft_offset;
  ostringstream outputStringStream;
  bool *dropped_out;
  polyprediction *hiddenbias_pred;
  polyprediction *hidden_units;
  loss_function *save_loss;
  float dropscale;
  float save_max_label;
  float save_min_label;
  _func_void_shared_data_ptr_float *save_set_minmax;
  label_data ld;
  shared_data *save_sd;
  shared_data sd;
  bool shouldOutput;
  undefined4 in_stack_fffffffffffffb68;
  float in_stack_fffffffffffffb6c;
  undefined4 in_stack_fffffffffffffb70;
  undefined4 in_stack_fffffffffffffb74;
  undefined4 in_stack_fffffffffffffb78;
  undefined4 in_stack_fffffffffffffb7c;
  undefined4 in_stack_fffffffffffffb80;
  undefined4 in_stack_fffffffffffffb84;
  size_t in_stack_fffffffffffffb88;
  undefined4 in_stack_fffffffffffffb90;
  undefined4 in_stack_fffffffffffffb94;
  example *in_stack_fffffffffffffb98;
  unsigned_long uVar25;
  undefined4 in_stack_fffffffffffffba0;
  undefined4 in_stack_fffffffffffffba4;
  float local_420;
  bool local_3f1;
  float local_3e8;
  uint local_3e4;
  uint local_3d0;
  undefined4 local_3c8;
  float fStack_3c4;
  undefined4 uStack_3c0;
  undefined4 uStack_3bc;
  undefined4 local_3b8;
  undefined4 uStack_3b4;
  undefined4 uStack_3b0;
  undefined4 uStack_3ac;
  string local_3a8 [32];
  uchar *local_388;
  uchar *puStack_380;
  size_t local_378;
  uchar *puStack_370;
  uchar *local_368;
  uchar *puStack_360;
  size_t local_358;
  uchar *puStack_350;
  uchar *local_348;
  uchar *puStack_340;
  size_t local_338;
  uchar *puStack_330;
  uchar *local_328;
  float local_318;
  float local_314;
  v_array<float> *local_310;
  float local_304;
  uint local_300;
  uint local_2fc;
  uint local_2f8;
  uint local_2f4;
  byte local_2ed;
  uint local_2ec;
  uint local_2e8;
  uint local_2e4;
  uint local_2e0;
  uchar *local_2d0;
  ostringstream local_2c8 [192];
  vw *in_stack_fffffffffffffdf8;
  nn *in_stack_fffffffffffffe00;
  float local_114;
  undefined1 local_100 [104];
  undefined4 local_98;
  undefined4 local_94;
  byte local_19;
  v_array<unsigned_char> *local_18;
  uint *local_8;
  
  local_19 = 0 < *(int *)(*(long *)(in_RDI + 0x4eb4) + 0x3530);
  local_3c8 = in_stack_fffffffffffffb68;
  fStack_3c4 = in_stack_fffffffffffffb6c;
  uStack_3c0 = in_stack_fffffffffffffb70;
  uStack_3bc = in_stack_fffffffffffffb74;
  local_3b8 = in_stack_fffffffffffffb78;
  uStack_3b4 = in_stack_fffffffffffffb7c;
  uStack_3b0 = in_stack_fffffffffffffb80;
  uStack_3ac = in_stack_fffffffffffffb84;
  local_18 = in_RDX;
  local_8 = in_RDI;
  if ((*(byte *)((long)in_RDI + 0x13aa9) & 1) == 0) {
    finish_setup(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
    local_3c8 = in_stack_fffffffffffffb68;
    fStack_3c4 = in_stack_fffffffffffffb6c;
    uStack_3c0 = in_stack_fffffffffffffb70;
    uStack_3bc = in_stack_fffffffffffffb74;
    local_3b8 = in_stack_fffffffffffffb78;
    uStack_3b4 = in_stack_fffffffffffffb7c;
    uStack_3b0 = in_stack_fffffffffffffb80;
    uStack_3ac = in_stack_fffffffffffffb84;
  }
  memcpy(local_100,(void *)**(undefined8 **)(local_8 + 0x4eb4),0xe0);
  uVar3 = **(undefined8 **)(local_8 + 0x4eb4);
  **(long **)(local_8 + 0x4eb4) = (long)local_100;
  puVar4 = local_18[0x341]._end;
  uVar5 = *(undefined8 *)(*(long *)(local_8 + 0x4eb4) + 0x40);
  local_3e8 = 2.0;
  if ((local_8[0x4ea4] & 1) == 0) {
    local_3e8 = 1.0;
  }
  uVar6 = *(undefined8 *)(*(long *)(local_8 + 0x4eb4) + 0x3548);
  lVar7 = *(long *)(local_8 + 0x4eb0);
  lVar8 = *(long *)(local_8 + 0x4eb2);
  lVar9 = *(long *)(local_8 + 0x4eae);
  std::__cxx11::ostringstream::ostringstream(local_2c8);
  *(code **)(*(long *)(local_8 + 0x4eb4) + 0x40) = noop_mm;
  *(undefined8 *)(*(long *)(local_8 + 0x4eb4) + 0x3548) = *(undefined8 *)(local_8 + 2);
  uVar1 = *(undefined4 *)(**(long **)(local_8 + 0x4eb4) + 0x68);
  *(undefined4 *)(**(long **)(local_8 + 0x4eb4) + 0x68) = 0xc0400000;
  uVar2 = *(undefined4 *)(**(long **)(local_8 + 0x4eb4) + 0x6c);
  *(undefined4 *)(**(long **)(local_8 + 0x4eb4) + 0x6c) = 0x40400000;
  local_2d0 = local_18[0x341]._begin;
  if ((*(byte *)((long)local_8 + 0x13aaa) & 1) != 0) {
    local_18[0x341]._begin = (uchar *)0x0;
  }
  *(uchar **)(local_8 + 0x3440) = local_18[0x341]._begin;
  LEARNER::learner<char,_example>::multipredict
            ((learner<char,_example> *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0)
             ,in_stack_fffffffffffffb98,
             CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),in_stack_fffffffffffffb88
             ,(polyprediction *)CONCAT44(uStack_3ac,uStack_3b0),SUB41((uint)uStack_3b4 >> 0x18,0));
  for (local_2e0 = 0; local_2e0 < *local_8; local_2e0 = local_2e0 + 1) {
    fVar23 = *(float *)(lVar8 + (ulong)local_2e0 * 0x20);
    if ((fVar23 == 0.0) && (!NAN(fVar23))) {
      fVar23 = merand48((uint64_t *)CONCAT44(uStack_3bc,uStack_3c0));
      local_8[0x3442] = (uint)(fVar23 + -0.5);
      LEARNER::learner<char,_example>::learn
                ((learner<char,_example> *)CONCAT44(uStack_3ac,uStack_3b0),
                 (example *)CONCAT44(uStack_3b4,local_3b8),CONCAT44(uStack_3bc,uStack_3c0));
      local_8[0x3442] = 0x7f7fffff;
    }
  }
  LEARNER::learner<char,_example>::multipredict
            ((learner<char,_example> *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0)
             ,in_stack_fffffffffffffb98,
             CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),in_stack_fffffffffffffb88
             ,(polyprediction *)CONCAT44(uStack_3ac,uStack_3b0),SUB41((uint)uStack_3b4 >> 0x18,0));
  for (local_2e4 = 0; local_2e4 < *local_8; local_2e4 = local_2e4 + 1) {
    local_3f1 = false;
    if ((local_8[0x4ea4] & 1) != 0) {
      fVar23 = merand48((uint64_t *)CONCAT44(uStack_3bc,uStack_3c0));
      local_3f1 = fVar23 < 0.5;
    }
    *(bool *)(lVar9 + (ulong)local_2e4) = local_3f1;
  }
  if (local_18[0x346]._begin != (uchar *)0x0) {
    for (local_2e8 = 0; local_2e8 < *local_8; local_2e8 = local_2e8 + 1) {
      add_passthrough_feature_magic
                ((example *)CONCAT44(uStack_3ac,uStack_3b0),CONCAT44(uStack_3b4,local_3b8),
                 CONCAT44(uStack_3bc,uStack_3c0),fStack_3c4);
      add_passthrough_feature_magic
                ((example *)CONCAT44(uStack_3ac,uStack_3b0),CONCAT44(uStack_3b4,local_3b8),
                 CONCAT44(uStack_3bc,uStack_3c0),fStack_3c4);
    }
  }
  if ((local_19 & 1) != 0) {
    for (local_2ec = 0; local_2ec < *local_8; local_2ec = local_2ec + 1) {
      if (local_2ec != 0) {
        std::operator<<((ostream *)local_2c8,' ');
      }
      poVar20 = (ostream *)std::ostream::operator<<(local_2c8,local_2ec);
      poVar20 = std::operator<<(poVar20,':');
      poVar20 = (ostream *)
                std::ostream::operator<<(poVar20,*(float *)(lVar7 + (ulong)local_2ec * 0x20));
      poVar20 = std::operator<<(poVar20,',');
      fVar23 = fasttanh(0.0);
      std::ostream::operator<<(poVar20,fVar23);
    }
  }
  *(undefined8 *)(*(long *)(local_8 + 0x4eb4) + 0x3548) = uVar6;
  *(undefined8 *)(*(long *)(local_8 + 0x4eb4) + 0x40) = uVar5;
  *(undefined4 *)(**(long **)(local_8 + 0x4eb4) + 0x68) = uVar1;
  *(undefined4 *)(**(long **)(local_8 + 0x4eb4) + 0x6c) = uVar2;
  local_18[0x341]._begin = local_2d0;
  local_2ed = 0;
  local_2f4 = 0;
  local_2f8 = 0;
  local_2fc = 0;
  while( true ) {
    local_8[0x1a31] = 0x3f800000;
    local_8[0xd3e] = 0x3f800000;
    *(uchar **)(local_8 + 0x4e74) = local_18[0x341]._begin;
    *(code **)(*(long *)(local_8 + 0x4eb4) + 0x40) = noop_mm;
    *(undefined8 *)(*(long *)(local_8 + 0x4eb4) + 0x3548) = *(undefined8 *)(local_8 + 2);
    uVar1 = *(undefined4 *)(**(long **)(local_8 + 0x4eb4) + 0x68);
    *(undefined4 *)(**(long **)(local_8 + 0x4eb4) + 0x68) = 0xbf800000;
    uVar2 = *(undefined4 *)(**(long **)(local_8 + 0x4eb4) + 0x6c);
    *(undefined4 *)(**(long **)(local_8 + 0x4eb4) + 0x6c) = 0x3f800000;
    for (local_300 = 0; local_300 < *local_8; local_300 = local_300 + 1) {
      if ((*(byte *)(lVar9 + (ulong)local_300) & 1) == 0) {
        local_420 = fasttanh(0.0);
        local_420 = local_3e8 * local_420;
      }
      else {
        local_420 = 0.0;
      }
      local_304 = local_420;
      local_310 = (v_array<float> *)(local_8 + 0xd26);
      pfVar21 = v_array<float>::operator[](local_310,(ulong)local_300);
      *pfVar21 = local_420;
      local_8[0x1a31] = (uint)(local_304 * local_304 + (float)local_8[0x1a31]);
      *(float *)&local_310[3]._begin = local_304 * local_304 + *(float *)&local_310[3]._begin;
      puVar22 = v_array<unsigned_long>::operator[]
                          ((v_array<unsigned_long> *)(local_310 + 1),(ulong)local_300);
      uVar25 = *puVar22;
      puVar22 = v_array<unsigned_long>::operator[]((v_array<unsigned_long> *)(local_8 + 0x4196),0);
      *puVar22 = uVar25;
      LEARNER::learner<char,_example>::predict
                ((learner<char,_example> *)CONCAT44(uStack_3ac,uStack_3b0),
                 (example *)CONCAT44(uStack_3b4,local_3b8),CONCAT44(uStack_3bc,uStack_3c0));
      local_314 = (float)local_8[0x4e80];
      if ((local_314 == 0.0) && (!NAN(local_314))) {
        dVar12 = std::sqrt((double)(ulong)(uint)(float)*local_8);
        local_318 = SUB84(dVar12,0);
        fVar23 = merand48((uint64_t *)CONCAT44(uStack_3bc,uStack_3c0));
        local_8[0x4e76] = (uint)((fVar23 + -0.5) / local_318);
        LEARNER::learner<char,_example>::update
                  ((learner<char,_example> *)CONCAT44(uStack_3ac,uStack_3b0),
                   (example *)CONCAT44(uStack_3b4,local_3b8),CONCAT44(uStack_3bc,uStack_3c0));
        local_8[0x4e76] = 0x7f7fffff;
      }
    }
    *(undefined8 *)(*(long *)(local_8 + 0x4eb4) + 0x3548) = uVar6;
    *(undefined8 *)(*(long *)(local_8 + 0x4eb4) + 0x40) = uVar5;
    *(undefined4 *)(**(long **)(local_8 + 0x4eb4) + 0x68) = uVar1;
    *(undefined4 *)(**(long **)(local_8 + 0x4eb4) + 0x6c) = uVar2;
    if ((local_8[0x4eaa] & 1) == 0) {
      *(uchar **)(local_8 + 0x1a0c) = local_18[0x341]._begin;
      *(uchar **)(local_8 + 0x1a16) = local_18[0x342]._end;
      puVar13 = local_18[0x341]._end;
      puVar14 = local_18[0x341].end_array;
      puVar16 = local_18[0x342]._begin;
      *(size_t *)(local_8 + 0x1a12) = local_18[0x341].erase_count;
      *(uchar **)(local_8 + 0x1a14) = puVar16;
      *(uchar **)(local_8 + 0x1a0e) = puVar13;
      *(uchar **)(local_8 + 0x1a10) = puVar14;
      local_8[0x1a20] = *(uint *)&local_18[0x343].end_array;
      local_8[0x1a2e] = 0;
      LEARNER::learner<char,_example>::learn
                ((learner<char,_example> *)CONCAT44(uStack_3ac,uStack_3b0),
                 (example *)CONCAT44(uStack_3b4,local_3b8),CONCAT44(uStack_3bc,uStack_3c0));
      memcpy(&local_18[0x341]._end,local_8 + 0x1a0e,0x28);
    }
    else {
      v_array<unsigned_char>::push_back
                ((v_array<unsigned_char> *)CONCAT44(uStack_3bc,uStack_3c0),
                 (uchar *)CONCAT44(fStack_3c4,local_3c8));
      local_328 = local_18[0x1a7]._end;
      local_338 = local_18[0x1a6].erase_count;
      puStack_330 = local_18[0x1a7]._begin;
      local_348 = local_18[0x1a6]._end;
      puStack_340 = local_18[0x1a6].end_array;
      local_388 = local_18[0x1a4]._end;
      puStack_380 = local_18[0x1a4].end_array;
      local_378 = local_18[0x1a4].erase_count;
      puStack_370 = local_18[0x1a5]._begin;
      local_368 = local_18[0x1a5]._end;
      puStack_360 = local_18[0x1a5].end_array;
      local_358 = local_18[0x1a5].erase_count;
      puStack_350 = local_18[0x1a6]._begin;
      *(uint *)&local_18[0x1a7]._end = local_8[0xd3e];
      puVar13 = *(uchar **)(local_8 + 0xd3c);
      local_18[0x1a6].erase_count = *(size_t *)(local_8 + 0xd3a);
      local_18[0x1a7]._begin = puVar13;
      puVar13 = *(uchar **)(local_8 + 0xd38);
      local_18[0x1a6]._end = *(uchar **)(local_8 + 0xd36);
      local_18[0x1a6].end_array = puVar13;
      puVar13 = *(uchar **)(local_8 + 0xd26);
      puVar14 = *(uchar **)(local_8 + 0xd28);
      sVar15 = *(size_t *)(local_8 + 0xd2a);
      puVar16 = *(uchar **)(local_8 + 0xd2c);
      puVar17 = *(uchar **)(local_8 + 0xd2e);
      puVar18 = *(uchar **)(local_8 + 0xd30);
      puVar19 = *(uchar **)(local_8 + 0xd34);
      local_18[0x1a5].erase_count = *(size_t *)(local_8 + 0xd32);
      local_18[0x1a6]._begin = puVar19;
      local_18[0x1a5]._end = puVar17;
      local_18[0x1a5].end_array = puVar18;
      local_18[0x1a4].erase_count = sVar15;
      local_18[0x1a5]._begin = puVar16;
      local_18[0x1a4]._end = puVar13;
      local_18[0x1a4].end_array = puVar14;
      *(float *)((long)&local_18[0x345].end_array + 4) =
           *(float *)((long)&local_18[0x345].end_array + 4) + (float)local_8[0xd3e];
      LEARNER::learner<char,_example>::learn
                ((learner<char,_example> *)CONCAT44(uStack_3ac,uStack_3b0),
                 (example *)CONCAT44(uStack_3b4,local_3b8),CONCAT44(uStack_3bc,uStack_3c0));
      local_8[0x1a2e] = *(uint *)&local_18[0x345]._end;
      local_8[0x1a30] = *(uint *)&local_18[0x345].end_array;
      *(float *)((long)&local_18[0x345].end_array + 4) =
           *(float *)((long)&local_18[0x345].end_array + 4) - (float)local_8[0xd3e];
      *(undefined4 *)&local_18[0x1a7]._end = 0;
      memcpy(&local_18[0x1a4]._end,&local_388,100);
      v_array<unsigned_char>::pop(local_18);
    }
    fVar23 = GD::finalize_prediction((shared_data *)CONCAT44(fStack_3c4,local_3c8),0.0);
    local_8[0x4ea0] = (uint)fVar23;
    if ((local_19 & 1) != 0) {
      poVar20 = std::operator<<((ostream *)local_2c8,' ');
      std::ostream::operator<<(poVar20,(float)local_8[0x1a2e]);
      pcVar10 = *(code **)(*(long *)(local_8 + 0x4eb4) + 0x3540);
      uVar1 = *(undefined4 *)(*(long *)(local_8 + 0x4eb4) + 0x3530);
      std::__cxx11::ostringstream::str();
      local_3c8 = (undefined4)local_18[0x343].erase_count;
      fStack_3c4 = (float)(local_18[0x343].erase_count >> 0x20);
      uStack_3c0 = SUB84(local_18[0x344]._begin,0);
      uStack_3bc = (undefined4)((ulong)local_18[0x344]._begin >> 0x20);
      local_3b8 = SUB84(local_18[0x344]._end,0);
      uStack_3b4 = (undefined4)((ulong)local_18[0x344]._end >> 0x20);
      uStack_3b0 = SUB84(local_18[0x344].end_array,0);
      uStack_3ac = (undefined4)((ulong)local_18[0x344].end_array >> 0x20);
      (*pcVar10)(uVar1,local_3a8);
      std::__cxx11::string::~string(local_3a8);
    }
    local_114 = SUB84(puVar4,0);
    if (((*(byte *)(*(long *)(local_8 + 0x4eb4) + 0x343a) & 1) != 0) &&
       ((local_114 != 3.4028235e+38 || (NAN(local_114))))) {
      plVar11 = (long *)(*(undefined8 **)(local_8 + 0x4eb4))[0x6a9];
      uVar24 = (**(code **)(*plVar11 + 0x30))
                         (local_8[0x4ea0],plVar11,**(undefined8 **)(local_8 + 0x4eb4));
      dVar12 = std::fabs((double)(ulong)uVar24);
      if (0.0 < SUB84(dVar12,0)) {
        *(undefined8 *)(*(long *)(local_8 + 0x4eb4) + 0x3548) = *(undefined8 *)(local_8 + 2);
        *(code **)(*(long *)(local_8 + 0x4eb4) + 0x40) = noop_mm;
        uVar1 = *(undefined4 *)(**(long **)(local_8 + 0x4eb4) + 0x68);
        *(undefined4 *)(**(long **)(local_8 + 0x4eb4) + 0x68) = 0xc0400000;
        uVar2 = *(undefined4 *)(**(long **)(local_8 + 0x4eb4) + 0x6c);
        *(undefined4 *)(**(long **)(local_8 + 0x4eb4) + 0x6c) = 0x40400000;
        local_2d0 = local_18[0x341]._begin;
        if ((*(byte *)((long)local_8 + 0x13aaa) & 1) != 0) {
          local_18[0x341]._begin = (uchar *)0x0;
        }
        for (local_3d0 = 0; local_3d0 < *local_8; local_3d0 = local_3d0 + 1) {
          if ((*(byte *)(lVar9 + (ulong)local_3d0) & 1) == 0) {
            v_array<float>::operator[]((v_array<float> *)(local_8 + 0xd26),(ulong)local_3d0);
            puVar22 = v_array<unsigned_long>::operator[]
                                ((v_array<unsigned_long> *)(local_8 + 0xd2e),(ulong)local_3d0);
            uVar25 = *puVar22;
            puVar22 = v_array<unsigned_long>::operator[]
                                ((v_array<unsigned_long> *)(local_8 + 0x4196),0);
            *puVar22 = uVar25;
            LEARNER::learner<char,_example>::predict
                      ((learner<char,_example> *)CONCAT44(uStack_3ac,uStack_3b0),
                       (example *)CONCAT44(uStack_3b4,local_3b8),CONCAT44(uStack_3bc,uStack_3c0));
            fVar23 = GD::finalize_prediction((shared_data *)CONCAT44(fStack_3c4,local_3c8),0.0);
            *(float *)&local_18[0x341]._end = fVar23;
            *(undefined4 *)&local_18[0x342].end_array =
                 *(undefined4 *)(lVar7 + (ulong)local_3d0 * 0x20);
            pfVar21 = (float *)(lVar7 + (ulong)local_3d0 * 0x20);
            if ((*(float *)&local_18[0x341]._end != *pfVar21) ||
               (NAN(*(float *)&local_18[0x341]._end) || NAN(*pfVar21))) {
              LEARNER::learner<char,_example>::update
                        ((learner<char,_example> *)CONCAT44(uStack_3ac,uStack_3b0),
                         (example *)CONCAT44(uStack_3b4,local_3b8),CONCAT44(uStack_3bc,uStack_3c0));
            }
          }
        }
        *(undefined8 *)(*(long *)(local_8 + 0x4eb4) + 0x3548) = uVar6;
        *(undefined8 *)(*(long *)(local_8 + 0x4eb4) + 0x40) = uVar5;
        *(undefined4 *)(**(long **)(local_8 + 0x4eb4) + 0x68) = uVar1;
        *(undefined4 *)(**(long **)(local_8 + 0x4eb4) + 0x6c) = uVar2;
        local_18[0x341]._begin = local_2d0;
      }
    }
    *(float *)&local_18[0x341]._end = local_114;
    if ((local_2ed & 1) == 0) {
      local_2f4 = local_8[0x1a2e];
      local_2f8 = local_8[0x4ea0];
      local_2fc = local_8[0x1a30];
    }
    if (((local_8[0x4ea4] & 1) == 0) || ((local_2ed & 1) != 0)) break;
    for (local_3e4 = 0; local_3e4 < *local_8; local_3e4 = local_3e4 + 1) {
      *(byte *)(lVar9 + (ulong)local_3e4) = (*(byte *)(lVar9 + (ulong)local_3e4) ^ 0xff) & 1;
    }
    local_2ed = 1;
  }
  *(uint *)&local_18[0x345]._end = local_2f4;
  *(uint *)&local_18[0x342].end_array = local_2f8;
  *(uint *)&local_18[0x345].end_array = local_2fc;
  **(undefined8 **)(local_8 + 0x4eb4) = uVar3;
  (*(code *)(*(undefined8 **)(local_8 + 0x4eb4))[8])(local_98,**(undefined8 **)(local_8 + 0x4eb4));
  (*(code *)(*(undefined8 **)(local_8 + 0x4eb4))[8])(local_94,**(undefined8 **)(local_8 + 0x4eb4));
  std::__cxx11::ostringstream::~ostringstream(local_2c8);
  return;
}

Assistant:

void predict_or_learn_multi(nn& n, single_learner& base, example& ec)
{
  bool shouldOutput = n.all->raw_prediction > 0;
  if (!n.finished_setup)
    finish_setup(n, *(n.all));
  shared_data sd;
  memcpy(&sd, n.all->sd, sizeof(shared_data));
  shared_data* save_sd = n.all->sd;
  n.all->sd = &sd;

  label_data ld = ec.l.simple;
  void (*save_set_minmax)(shared_data*, float) = n.all->set_minmax;
  float save_min_label;
  float save_max_label;
  float dropscale = n.dropout ? 2.0f : 1.0f;
  loss_function* save_loss = n.all->loss;

  polyprediction* hidden_units = n.hidden_units_pred;
  polyprediction* hiddenbias_pred = n.hiddenbias_pred;
  bool* dropped_out = n.dropped_out;

  ostringstream outputStringStream;

  n.all->set_minmax = noop_mm;
  n.all->loss = n.squared_loss;
  save_min_label = n.all->sd->min_label;
  n.all->sd->min_label = hidden_min_activation;
  save_max_label = n.all->sd->max_label;
  n.all->sd->max_label = hidden_max_activation;

  uint64_t save_ft_offset = ec.ft_offset;

  if (n.multitask)
    ec.ft_offset = 0;

  n.hiddenbias.ft_offset = ec.ft_offset;

  if (recompute_hidden)
  {
    base.multipredict(n.hiddenbias, 0, n.k, hiddenbias_pred, true);

    for (unsigned int i = 0; i < n.k; ++i)
      // avoid saddle point at 0
      if (hiddenbias_pred[i].scalar == 0)
      {
        n.hiddenbias.l.simple.label = (float)(merand48(n.all->random_state) - 0.5);
        base.learn(n.hiddenbias, i);
        n.hiddenbias.l.simple.label = FLT_MAX;
      }

    base.multipredict(ec, 0, n.k, hidden_units, true);

    for (unsigned int i = 0; i < n.k; ++i) dropped_out[i] = (n.dropout && merand48(n.xsubi) < 0.5);

    if (ec.passthrough)
      for (unsigned int i = 0; i < n.k; ++i)
      {
        add_passthrough_feature(ec, i * 2, hiddenbias_pred[i].scalar);
        add_passthrough_feature(ec, i * 2 + 1, hidden_units[i].scalar);
      }
  }

  if (shouldOutput)
    for (unsigned int i = 0; i < n.k; ++i)
    {
      if (i > 0)
        outputStringStream << ' ';
      outputStringStream << i << ':' << hidden_units[i].scalar << ','
                         << fasttanh(hidden_units[i].scalar);  // TODO: huh, what was going on here?
    }

  n.all->loss = save_loss;
  n.all->set_minmax = save_set_minmax;
  n.all->sd->min_label = save_min_label;
  n.all->sd->max_label = save_max_label;
  ec.ft_offset = save_ft_offset;

  bool converse = false;
  float save_partial_prediction = 0;
  float save_final_prediction = 0;
  float save_ec_loss = 0;

CONVERSE:  // That's right, I'm using goto.  So sue me.

  n.output_layer.total_sum_feat_sq = 1;
  n.output_layer.feature_space[nn_output_namespace].sum_feat_sq = 1;

  n.outputweight.ft_offset = ec.ft_offset;

  n.all->set_minmax = noop_mm;
  n.all->loss = n.squared_loss;
  save_min_label = n.all->sd->min_label;
  n.all->sd->min_label = -1;
  save_max_label = n.all->sd->max_label;
  n.all->sd->max_label = 1;

  for (unsigned int i = 0; i < n.k; ++i)
  {
    float sigmah = (dropped_out[i]) ? 0.0f : dropscale * fasttanh(hidden_units[i].scalar);
    features& out_fs = n.output_layer.feature_space[nn_output_namespace];
    out_fs.values[i] = sigmah;

    n.output_layer.total_sum_feat_sq += sigmah * sigmah;
    out_fs.sum_feat_sq += sigmah * sigmah;

    n.outputweight.feature_space[nn_output_namespace].indicies[0] = out_fs.indicies[i];
    base.predict(n.outputweight, n.k);
    float wf = n.outputweight.pred.scalar;

    // avoid saddle point at 0
    if (wf == 0)
    {
      float sqrtk = sqrt((float)n.k);
      n.outputweight.l.simple.label = (float)(merand48(n.all->random_state) - 0.5) / sqrtk;
      base.update(n.outputweight, n.k);
      n.outputweight.l.simple.label = FLT_MAX;
    }
  }

  n.all->loss = save_loss;
  n.all->set_minmax = save_set_minmax;
  n.all->sd->min_label = save_min_label;
  n.all->sd->max_label = save_max_label;

  if (n.inpass)
  {
    // TODO: this is not correct if there is something in the
    // nn_output_namespace but at least it will not leak memory
    // in that case
    ec.indices.push_back(nn_output_namespace);
    features save_nn_output_namespace = ec.feature_space[nn_output_namespace];
    ec.feature_space[nn_output_namespace] = n.output_layer.feature_space[nn_output_namespace];
    ec.total_sum_feat_sq += n.output_layer.feature_space[nn_output_namespace].sum_feat_sq;
    if (is_learn)
      base.learn(ec, n.k);
    else
      base.predict(ec, n.k);
    n.output_layer.partial_prediction = ec.partial_prediction;
    n.output_layer.loss = ec.loss;
    ec.total_sum_feat_sq -= n.output_layer.feature_space[nn_output_namespace].sum_feat_sq;
    ec.feature_space[nn_output_namespace].sum_feat_sq = 0;
    ec.feature_space[nn_output_namespace] = save_nn_output_namespace;
    ec.indices.pop();
  }
  else
  {
    n.output_layer.ft_offset = ec.ft_offset;
    n.output_layer.l = ec.l;
    n.output_layer.weight = ec.weight;
    n.output_layer.partial_prediction = 0;
    if (is_learn)
      base.learn(n.output_layer, n.k);
    else
      base.predict(n.output_layer, n.k);
    ec.l = n.output_layer.l;
  }

  n.prediction = GD::finalize_prediction(n.all->sd, n.output_layer.partial_prediction);

  if (shouldOutput)
  {
    outputStringStream << ' ' << n.output_layer.partial_prediction;
    n.all->print_text(n.all->raw_prediction, outputStringStream.str(), ec.tag);
  }

  if (is_learn && n.all->training && ld.label != FLT_MAX)
  {
    float gradient = n.all->loss->first_derivative(n.all->sd, n.prediction, ld.label);

    if (fabs(gradient) > 0)
    {
      n.all->loss = n.squared_loss;
      n.all->set_minmax = noop_mm;
      save_min_label = n.all->sd->min_label;
      n.all->sd->min_label = hidden_min_activation;
      save_max_label = n.all->sd->max_label;
      n.all->sd->max_label = hidden_max_activation;
      save_ft_offset = ec.ft_offset;

      if (n.multitask)
        ec.ft_offset = 0;

      for (unsigned int i = 0; i < n.k; ++i)
      {
        if (!dropped_out[i])
        {
          float sigmah = n.output_layer.feature_space[nn_output_namespace].values[i] / dropscale;
          float sigmahprime = dropscale * (1.0f - sigmah * sigmah);
          n.outputweight.feature_space[nn_output_namespace].indicies[0] =
              n.output_layer.feature_space[nn_output_namespace].indicies[i];
          base.predict(n.outputweight, n.k);
          float nu = n.outputweight.pred.scalar;
          float gradhw = 0.5f * nu * gradient * sigmahprime;

          ec.l.simple.label = GD::finalize_prediction(n.all->sd, hidden_units[i].scalar - gradhw);
          ec.pred.scalar = hidden_units[i].scalar;
          if (ec.l.simple.label != hidden_units[i].scalar)
            base.update(ec, i);
        }
      }

      n.all->loss = save_loss;
      n.all->set_minmax = save_set_minmax;
      n.all->sd->min_label = save_min_label;
      n.all->sd->max_label = save_max_label;
      ec.ft_offset = save_ft_offset;
    }
  }

  ec.l.simple.label = ld.label;

  if (!converse)
  {
    save_partial_prediction = n.output_layer.partial_prediction;
    save_final_prediction = n.prediction;
    save_ec_loss = n.output_layer.loss;
  }

  if (n.dropout && !converse)
  {
    for (unsigned int i = 0; i < n.k; ++i)
    {
      dropped_out[i] = !dropped_out[i];
    }

    converse = true;
    goto CONVERSE;
  }

  ec.partial_prediction = save_partial_prediction;
  ec.pred.scalar = save_final_prediction;
  ec.loss = save_ec_loss;

  n.all->sd = save_sd;
  n.all->set_minmax(n.all->sd, sd.min_label);
  n.all->set_minmax(n.all->sd, sd.max_label);
}